

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void dd_simplify_fname_c(char *s)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (s == (char *)0x0) {
    return;
  }
  uVar4 = strlen(s);
  iVar11 = (int)uVar4;
  iVar12 = 8;
  if (iVar11 < 8) {
    iVar12 = iVar11;
  }
  pvVar5 = memchr(s,0x3a,(long)iVar12);
  if (pvVar5 != (void *)0x0) {
    lVar7 = ((long)pvVar5 + 3) - (long)s;
    if (((lVar7 < iVar11) && (*(char *)((long)pvVar5 + 1) == '/')) &&
       (*(char *)((long)pvVar5 + 2) == '/')) {
      uVar4 = (ulong)(uint)(iVar11 - (int)lVar7);
      s = (char *)((long)pvVar5 + 3);
    }
  }
LAB_00177b6e:
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      uVar10 = uVar6;
      if ((0x20 < (ulong)(byte)s[uVar6]) ||
         ((0x100002600U >> ((ulong)(byte)s[uVar6] & 0x3f) & 1) == 0)) break;
      uVar6 = uVar6 + 1;
      uVar10 = uVar4 & 0xffffffff;
    } while ((uVar4 & 0xffffffff) != uVar6);
  }
  iVar12 = (int)uVar10;
  if (iVar12 != 0) {
    uVar8 = (int)uVar4 - iVar12;
    uVar4 = (ulong)uVar8;
    memmove(s,s + (uVar10 & 0xffffffff),(long)(int)(uVar8 + 1));
  }
  uVar8 = (int)uVar4 - 1;
  uVar10 = (ulong)uVar8;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar8;
    do {
      if ((0x20 < (ulong)(byte)s[uVar10]) ||
         ((0x100002600U >> ((ulong)(byte)s[uVar10] & 0x3f) & 1) == 0)) goto LAB_00177be6;
      bVar3 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar3);
    uVar10 = 0xffffffff;
  }
LAB_00177be6:
  uVar9 = (uint)uVar10;
  if ((int)uVar9 < (int)uVar8) {
    s[(long)(int)uVar9 + 1] = '\0';
    uVar4 = (long)(int)uVar9 + 1;
  }
  bVar3 = (int)uVar9 < (int)uVar8 || iVar12 != 0;
  iVar12 = (int)uVar4;
  if (0 < iVar12) {
    uVar10 = 0xffffffffffffffff;
    uVar6 = 0;
    do {
      if (s[uVar6] == '\"') {
        goto LAB_00177c20;
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar10 + 1;
    } while ((uVar4 & 0xffffffff) != uVar6);
  }
  goto LAB_00177c74;
  while (uVar1 = uVar10 + 1, lVar7 = uVar10 + 2, uVar10 = uVar1, s[lVar7] != '\"') {
LAB_00177c20:
    if ((uVar4 & 0xffffffff) <= uVar10 + 2) goto LAB_00177c74;
  }
  memmove(s + uVar6,s + uVar6 + 1,(long)(iVar12 - (int)uVar6));
  if ((int)uVar9 < (int)uVar8) {
    uVar8 = uVar9;
  }
  memmove(s + (uVar1 & 0xffffffff),s + (uVar1 & 0xffffffff) + 1,(long)(int)(uVar8 - (int)uVar1));
  uVar4 = (ulong)(iVar12 - 2);
  bVar3 = true;
LAB_00177c74:
  if (!bVar3) goto code_r0x00177c7c;
  goto LAB_00177b6e;
code_r0x00177c7c:
  if (1 < (int)uVar4) {
    uVar10 = 1;
    do {
      if (s[uVar10] == '\\') {
        s[uVar10] = '/';
      }
      uVar10 = uVar10 + 1;
    } while ((uVar4 & 0xffffffff) != uVar10);
  }
  if (1 < (int)uVar4) {
    iVar12 = 1;
    do {
      iVar11 = iVar12;
      if ((s[iVar12] == '/') && (s[(long)iVar12 + -1] == '/')) {
        iVar11 = iVar12 + -1;
        memmove(s + iVar12,s + iVar12 + 1,(long)((int)uVar4 - iVar12));
        uVar4 = (ulong)((int)uVar4 - 1);
      }
      iVar12 = iVar11 + 1;
    } while (iVar12 < (int)uVar4);
  }
  if (1 < (int)uVar4) {
    uVar10 = uVar4 & 0xffffffff;
    do {
      uVar4 = uVar10;
      if ((*s != '.') || (s[1] != '/')) break;
      uVar4 = uVar10 - 2;
      memmove(s,s + 2,uVar10 - 1);
      bVar3 = 3 < (long)uVar10;
      uVar10 = uVar4;
    } while (bVar3);
  }
  if (1 < (int)uVar4) {
    iVar12 = 1;
    do {
      iVar11 = iVar12;
      if (((s[iVar12] == '.') && ((s[(long)iVar12 + -1] == ':' || (s[(long)iVar12 + -1] == '/'))))
         && ((cVar2 = s[(long)iVar12 + 1], cVar2 == '/' || (cVar2 == '\0')))) {
        iVar11 = iVar12 + -1;
        uVar8 = (int)uVar4 + ~(uint)(cVar2 == '/');
        uVar4 = (ulong)uVar8;
        memmove(s + iVar12,s + iVar12 + (ulong)(cVar2 == '/') + 1,(long)(int)((uVar8 - iVar12) + 1))
        ;
      }
      iVar12 = iVar11 + 1;
    } while (iVar12 < (int)uVar4);
  }
  if (2 < (int)uVar4) {
    iVar12 = 2;
    do {
      if ((((s[(long)iVar12 + -2] == '/') && (s[(long)iVar12 + -1] == '.')) && (s[iVar12] == '.'))
         && ((cVar2 = s[(long)iVar12 + 1], cVar2 == '/' || (cVar2 == '\0')))) {
        uVar10 = (ulong)(iVar12 - 3U);
        if (2 < iVar12) {
          uVar10 = (ulong)(iVar12 - 3U);
          do {
            if ((s[uVar10] == '/') || (s[uVar10] == ':')) goto LAB_00177def;
            bVar3 = 0 < (long)uVar10;
            uVar10 = uVar10 - 1;
          } while (bVar3);
          uVar10 = 0xffffffff;
        }
LAB_00177def:
        iVar11 = (int)uVar10;
        lVar7 = (long)iVar11 + 1;
        iVar13 = (int)lVar7;
        if ((iVar13 < iVar12 + -2) &&
           (((iVar12 - iVar11 != 5 || (s[lVar7] != '.')) || (s[(long)iVar11 + 2] != '.')))) {
          iVar12 = (iVar12 - iVar11) + (uint)(cVar2 == '/');
          uVar8 = (int)uVar4 - iVar12;
          uVar4 = (ulong)uVar8;
          memmove(s + iVar13,s + iVar13 + iVar12,(long)(int)(uVar8 - iVar11));
          iVar12 = 1;
          if (1 < iVar13) {
            iVar12 = iVar13;
          }
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < (int)uVar4);
  }
  return;
}

Assistant:

void dd_simplify_fname_c(char *s)
{
  if(!s) return;
  int i,len=strlen(s);

  // check for URL format to prevent removal of ://
  if (char *semi = (char*)memchr(s, ':', len > 8 ? 8 : len))
    if (len > (semi+3-s) && semi[1] == '/' && semi[2] == '/')
    {
      len -= int(semi+3-s);
      s = semi+3;
    }

  for(;;) {
    bool ok=false;
    // remove leading spaces
    for(i=0;i<len;++i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i>0) {len-=i;memmove(s,s+i,len+1); ok=true;}
    // remove trailing spaces
    for(i=len-1;i>=0;--i)
      if(s[i]!=' ' && s[i]!='\t' && s[i]!='\n' && s[i]!='\r') break;
    if(i<len-1) {s[len=i+1]=0; ok=true;}
    // remove quotes
    for(i=0;i<len;++i) if(s[i]=='"') break;
    if(i<len) {
      int qs=i;
      for(++i;i<len;++i) if(s[i]=='"') break;
      if(i<len) {
        memmove(s+qs,s+qs+1,len-qs); --len; --i;
        memmove(s+i,s+i+1,len-i); --len;
        ok=true;
      }
    }
    if(!ok) break;
  }

  // replace all back slashes with normal ones
  for(i=1;i<len;++i)
    if(s[i]==PATH_DELIM_BACK )
      s[i]=PATH_DELIM;

  // remove extra slashes
  for(i=1;i<len;++i) if(s[i]==PATH_DELIM)
    if(s[i-1]==PATH_DELIM)
      {memmove(s+i,s+i+1,len-i); --len; --i;}

  // remove extra cur-dirs
  while (len>1)
    if (s[0]=='.' && s[1]==PATH_DELIM)
    {
      len-=2;
      memmove(s,s+2,len+1);
    }
    else
      break;

  for(i=1;i<len;++i) if(s[i]=='.' && (s[i-1]==PATH_DELIM || s[i-1]==':'))
    if(s[i+1]==PATH_DELIM || s[i+1]==0) {
      int e=1; if(s[i+1]==PATH_DELIM) ++e;
      len-=e; memmove(s+i,s+i+e,len+1-i);
      --i;
    }

  // remove extra up-dirs
  for (i=2; i<len; ++i) if (s[i-2]==PATH_DELIM && s[i-1]=='.' && s[i]=='.')
    if (s[i+1]==PATH_DELIM || s[i+1]==0)
    {
      int j;
      for (j=i-3;j>=0;--j) if(s[j]==PATH_DELIM || s[j]==':') break;

      if (++j<i-2)
      {
        int e=i+1-j;

        if (e!=5 || s[j]!='.' || s[j+1]!='.')
        {
          if (s[i+1]==PATH_DELIM) ++e;

          len-=e; memmove(s+j, s+j+e, len+1-j);
          i=std::max(j,1);
        }
      }
    }
}